

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

void CreateJsRTContext_TTDCallback(void *runtimeHandle,ScriptContext **result)

{
  JsErrorCode JVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *this;
  undefined1 local_30 [4];
  JsErrorCode err;
  TTDRecorder dummyActionEntryPopper;
  JsContextRef newContext;
  ScriptContext **result_local;
  void *runtimeHandle_local;
  
  dummyActionEntryPopper.m_resultPtr = (TTDVar *)0x0;
  *result = (ScriptContext *)0x0;
  TTD::TTDJsRTActionResultAutoRecorder::TTDJsRTActionResultAutoRecorder
            ((TTDJsRTActionResultAutoRecorder *)local_30);
  JVar1 = CreateContextCore(runtimeHandle,(TTDRecorder *)local_30,false,false,true,
                            &dummyActionEntryPopper.m_resultPtr);
  if (JVar1 != JsNoError) {
    TTDAbort_unrecoverable_error("Shouldn\'t fail on us!!!");
  }
  pSVar2 = JsrtContext::GetScriptContext((JsrtContext *)dummyActionEntryPopper.m_resultPtr);
  *result = pSVar2;
  this = Js::ScriptContext::GetLibrary(*result);
  Js::JavascriptLibrary::SetNativeHostPromiseContinuationFunction
            (this,TTDDummyPromiseContinuationCallback,(void *)0x0);
  JsrtContext::TrySetCurrent((JsrtContext *)dummyActionEntryPopper.m_resultPtr);
  return;
}

Assistant:

void CALLBACK CreateJsRTContext_TTDCallback(void* runtimeHandle, Js::ScriptContext** result)
{
    JsContextRef newContext = nullptr;
    *result = nullptr;

    TTDRecorder dummyActionEntryPopper;
    JsErrorCode err = CreateContextCore(static_cast<JsRuntimeHandle>(runtimeHandle), dummyActionEntryPopper, false /*inRecordMode*/, false /*activelyRecording*/, true /*inReplayMode*/, &newContext);
    TTDAssert(err == JsNoError, "Shouldn't fail on us!!!");

    *result = static_cast<JsrtContext*>(newContext)->GetScriptContext();
    (*result)->GetLibrary()->SetNativeHostPromiseContinuationFunction((Js::JavascriptLibrary::PromiseContinuationCallback)TTDDummyPromiseContinuationCallback, nullptr);

    //To ensure we have a valid context active (when we next try and inflate into this context) set this as active by convention
    JsrtContext::TrySetCurrent(static_cast<JsrtContext*>(newContext));
}